

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

void lua_concat(lua_State *L,int n)

{
  StkId pSVar1;
  TString *pTVar2;
  TString *x_;
  TValue *io;
  int n_local;
  lua_State *L_local;
  
  if (n < 1) {
    pSVar1 = (L->top).p;
    pTVar2 = luaS_newlstr(L,"",0);
    *(TString **)pSVar1 = pTVar2;
    (pSVar1->val).tt_ = pTVar2->tt | 0x40;
    (L->top).p = (StkId)((L->top).offset + 0x10);
  }
  else {
    luaV_concat(L,n);
  }
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  return;
}

Assistant:

LUA_API void lua_concat (lua_State *L, int n) {
  lua_lock(L);
  api_checknelems(L, n);
  if (n > 0)
    luaV_concat(L, n);
  else {  /* nothing to concatenate */
    setsvalue2s(L, L->top.p, luaS_newlstr(L, "", 0));  /* push empty string */
    api_incr_top(L);
  }
  luaC_checkGC(L);
  lua_unlock(L);
}